

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O0

int get_branchlength(uint32_t **pptrptr,int *minptr,int *errcodeptr,int *lcptr,
                    parsed_recurse_check *recurses,compile_block_8 *cb)

{
  short sVar1;
  uint16_t uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  BOOL BVar6;
  PCRE2_SPTR8 str1;
  uint32_t *puVar7;
  uint32_t length;
  uint32_t meta_code;
  named_group_8 *ng;
  BOOL is_dupname;
  PCRE2_SPTR8 name;
  int local_a8;
  int i;
  uint32_t max;
  uint32_t min;
  uint32_t itemminlength;
  uint32_t itemlength;
  uint32_t group;
  uint32_t escape;
  uint32_t *gptrend;
  uint32_t *gptr;
  parsed_recurse_check *r;
  parsed_recurse_check this_recurse;
  size_t offset;
  uint32_t *pptr;
  uint32_t lastitemminlength;
  uint32_t lastitemlength;
  int groupminlength;
  int grouplength;
  int branchminlength;
  int branchlength;
  compile_block_8 *cb_local;
  parsed_recurse_check *recurses_local;
  int *lcptr_local;
  int *errcodeptr_local;
  int *minptr_local;
  uint32_t **pptrptr_local;
  
  grouplength = 0;
  groupminlength = 0;
  pptr._4_4_ = 0;
  pptr._0_4_ = 0;
  offset = (size_t)*pptrptr;
  iVar5 = *lcptr;
  *lcptr = iVar5 + 1;
  _branchminlength = cb;
  cb_local = (compile_block_8 *)recurses;
  recurses_local = (parsed_recurse_check *)lcptr;
  lcptr_local = errcodeptr;
  errcodeptr_local = minptr;
  minptr_local = (int *)pptrptr;
  if (2000 < iVar5) {
    *errcodeptr = 0x87;
    return -1;
  }
  do {
    itemminlength = 0;
    min = 0;
    max = 0;
    if (*(uint *)offset < 0x80000000) {
      max = 1;
      min = 1;
      goto LAB_00154905;
    }
    sVar1 = *(short *)(offset + 2);
    if (sVar1 == -0x7fff) goto LAB_0015496a;
    if (sVar1 == -0x7ffe) goto LAB_001547a0;
    if (sVar1 == -0x7ffd) {
      if (((_branchminlength->external_options & 0x200) != 0) ||
         ((_branchminlength->external_flags & 0x200000) != 0)) goto LAB_001548ed;
      itemminlength = *(uint *)offset & 0xffff;
      if (itemminlength < 10) {
        this_recurse.groupptr = (uint32_t *)_branchminlength->small_ref_offset[itemminlength];
      }
      else {
LAB_00154567:
        itemminlength = *(uint *)offset & 0xffff;
        this_recurse.groupptr =
             (uint32_t *)CONCAT44(*(undefined4 *)(offset + 4),*(undefined4 *)(offset + 8));
        offset = offset + 8;
      }
LAB_0015459d:
      if (_branchminlength->bracount < itemminlength) {
        _branchminlength->erroroffset = (size_t)this_recurse.groupptr;
        *lcptr_local = 0x73;
        return -1;
      }
      if (itemminlength == 0) goto LAB_001548ed;
      for (gptrend = _branchminlength->parsed_pattern; *gptrend != 0x80000000; gptrend = gptrend + 1
          ) {
        if ((*gptrend & 0xffff0000) == 0x80050000) {
          gptrend = gptrend + 1;
        }
        else if (*gptrend == (itemminlength | 0x80080000)) break;
      }
      puVar7 = parsed_skip(gptrend + 1,2);
      if (puVar7 == (uint32_t *)0x0) {
LAB_00154986:
        *lcptr_local = 0xbe;
        return -1;
      }
      if ((gptrend < offset) && (offset < puVar7)) {
LAB_001548ed:
        *lcptr_local = 0x7d;
        return -1;
      }
      for (gptr = (uint32_t *)cb_local;
          (gptr != (uint32_t *)0x0 && (*(uint32_t **)(gptr + 2) != gptrend));
          gptr = *(uint32_t **)gptr) {
      }
      if (gptr != (uint32_t *)0x0) goto LAB_001548ed;
      r = (parsed_recurse_check *)cb_local;
      this_recurse.prev = (parsed_recurse_check *)gptrend;
      gptrend = gptrend + 1;
      min = get_grouplength(&gptrend,(int *)&lastitemminlength,0,lcptr_local,(int *)recurses_local,
                            itemminlength,(parsed_recurse_check *)&r,_branchminlength);
      if ((int)min < 0) {
        if (*lcptr_local != 0) {
          return -1;
        }
        goto LAB_001548ed;
      }
      max = lastitemminlength;
      lastitemlength = min;
    }
    else {
      if (sVar1 == -0x7ffc) {
        if ((_branchminlength->external_options & 0x200) != 0) goto LAB_001548ed;
LAB_00154385:
        uVar2 = 0;
        _length = _branchminlength->named_groups;
        uVar4 = *(uint *)offset;
        uVar3 = *(uint *)(offset + 4);
        this_recurse.groupptr =
             (uint32_t *)CONCAT44(*(undefined4 *)(offset + 8),*(undefined4 *)(offset + 0xc));
        offset = offset + 0xc;
        str1 = _branchminlength->start_pattern + (long)this_recurse.groupptr;
        for (name._4_4_ = 0; name._4_4_ < (int)(uint)_branchminlength->names_found;
            name._4_4_ = name._4_4_ + 1) {
          if ((uVar3 == _length->length) &&
             (iVar5 = coda__pcre2_strncmp_8(str1,_length->name,(ulong)uVar3), iVar5 == 0)) {
            itemminlength = _length->number;
            uVar2 = _length->isdup;
            break;
          }
          _length = _length + 1;
        }
        if (itemminlength == 0) {
          *lcptr_local = 0x73;
          _branchminlength->erroroffset = (size_t)this_recurse.groupptr;
          return -1;
        }
        if (((uVar4 & 0xffff0000) != 0x80210000) &&
           ((uVar2 != 0 || ((_branchminlength->external_flags & 0x200000) != 0))))
        goto LAB_001548ed;
        goto LAB_0015459d;
      }
      if (sVar1 == -0x7ffb) {
        max = 1;
        min = 1;
        offset = offset + 4;
      }
      else if (sVar1 == -0x7ffa) {
        offset = offset + 0xc;
      }
      else if (sVar1 == -0x7ff9) {
        offset = offset + 0x14;
      }
      else {
        if (sVar1 == -0x7ff8) {
          itemminlength = *(uint *)offset & 0xffff;
          goto LAB_001547a0;
        }
        if (sVar1 != -0x7ff7) {
          if (sVar1 == -0x7ff6) {
LAB_001540e0:
            max = 1;
            min = 1;
            offset = (size_t)parsed_skip((uint32_t *)offset,1);
            if ((uint32_t *)offset == (uint32_t *)0x0) goto LAB_00154986;
          }
          else if (sVar1 == -0x7ff4) {
LAB_00154117:
            max = 1;
            min = 1;
          }
          else {
            if (sVar1 == -0x7ff2) goto LAB_001540e0;
            if (sVar1 == -0x7ff1) {
              offset = offset + 4;
            }
            else {
              if (sVar1 == -0x7ff0) {
                offset = (size_t)parsed_skip((uint32_t *)(offset + 4),2);
                goto LAB_00154905;
              }
              if ((((sVar1 == -0x7fef) || (sVar1 == -0x7fee)) || (sVar1 == -0x7fed)) ||
                 (sVar1 == -0x7fec)) {
                offset = offset + 0x10;
              }
              else {
                if (sVar1 != -0x7feb) {
                  if (sVar1 != -0x7fea) {
                    if (sVar1 == -0x7fe9) goto LAB_00154117;
                    if (sVar1 == -0x7fe8) {
                      uVar4 = *(uint *)offset & 0xffff;
                      if (uVar4 == 0x16) {
                        return -1;
                      }
                      if (uVar4 == 0x11) {
                        max = 1;
                        min = 2;
                      }
                      else if ((5 < uVar4) && (uVar4 < 0x17)) {
                        if (((_branchminlength->external_options & 0x80000) != 0) && (uVar4 == 0xe))
                        {
                          *lcptr_local = 0x88;
                          return -1;
                        }
                        max = 1;
                        min = 1;
                        if ((uVar4 == 0x10) || (uVar4 == 0xf)) {
                          offset = offset + 4;
                        }
                      }
                    }
                    else {
                      if (sVar1 == -0x7fe7) {
LAB_0015496a:
                        *(size_t *)minptr_local = offset;
                        *errcodeptr_local = groupminlength;
                        return grouplength;
                      }
                      if (sVar1 == -0x7fe6) {
LAB_001547a0:
                        offset = offset + 4;
                        goto LAB_001547ac;
                      }
                      if (sVar1 == -0x7fe5) {
                        offset = offset + 8;
                        goto LAB_00154905;
                      }
                      if (sVar1 == -0x7fe0) goto LAB_00154567;
                      if (sVar1 == -0x7fdf) goto LAB_00154385;
                      if (sVar1 == -0x7fde) goto LAB_001547a0;
                      if ((sVar1 == -0x7fdd) || (sVar1 == -0x7fdc)) {
LAB_00154217:
                        iVar5 = check_lookbehinds((uint32_t *)(offset + 4),(uint32_t **)&offset,
                                                  (parsed_recurse_check *)cb_local,_branchminlength,
                                                  (int *)recurses_local);
                        *lcptr_local = iVar5;
                        if (*lcptr_local != 0) {
                          return -1;
                        }
                        iVar5 = *(int *)(offset + 4);
                        if (((((iVar5 == -0x7fcc0000) || (iVar5 == -0x7fcb0000)) ||
                             ((iVar5 == -0x7fca0000 ||
                              (((iVar5 == -0x7fc90000 || (iVar5 == -0x7fc80000)) ||
                               (iVar5 == -0x7fc70000)))))) ||
                            ((iVar5 == -0x7fc60000 || (iVar5 == -0x7fc50000)))) ||
                           (iVar5 == -0x7fc40000)) {
                          offset = offset + 4;
                        }
                        else if (((iVar5 == -0x7fc30000) || (iVar5 == -0x7fc20000)) ||
                                (iVar5 == -0x7fc10000)) {
                          offset = offset + 0xc;
                        }
                      }
                      else {
                        if ((sVar1 != -0x7fdb) && (sVar1 != -0x7fda)) {
                          if (sVar1 == -0x7fd9) goto LAB_00154217;
                          if (sVar1 != -0x7fd8) {
                            if (sVar1 == -0x7fd7) goto LAB_00154085;
                            if ((sVar1 == -0x7fd6) || (sVar1 == -0x7fd5)) {
                              offset = (size_t)parsed_skip((uint32_t *)offset,0);
                              if ((uint32_t *)offset != (uint32_t *)0x0) goto LAB_0015496a;
                              goto LAB_00154986;
                            }
                            if (sVar1 != -0x7fd4) {
                              if (sVar1 == -0x7fd3) {
LAB_00154085:
                                offset = offset + (ulong)(*(int *)(offset + 4) + 1) * 4;
                              }
                              else if (sVar1 != -0x7fd2) {
                                if (sVar1 == -0x7fd1) goto LAB_00154085;
                                if (sVar1 != -0x7fd0) {
                                  if (sVar1 == -0x7fcf) goto LAB_00154085;
                                  if (sVar1 != -0x7fce) {
                                    if (sVar1 == -0x7fcd) goto LAB_00154085;
                                    if (((sVar1 == -0x7fc6) || (sVar1 == -0x7fc5)) ||
                                       (sVar1 == -0x7fc4)) {
                                      i = 0;
                                      local_a8 = 1;
                                    }
                                    else {
                                      if (((sVar1 != -0x7fc3) && (sVar1 != -0x7fc2)) &&
                                         (sVar1 != -0x7fc1)) goto LAB_001548ed;
                                      i = *(int *)(offset + 4);
                                      local_a8 = *(int *)(offset + 8);
                                      offset = offset + 8;
                                    }
                                    if (local_a8 == 0x10000) goto LAB_001548ed;
                                    if (((pptr._4_4_ != 0) && (local_a8 != 0)) &&
                                       ((0x7fffffffU - grouplength) / pptr._4_4_ < local_a8 - 1U)) {
                                      *lcptr_local = 0xbb;
                                      return -1;
                                    }
                                    if (i == 0) {
                                      groupminlength = groupminlength - (uint32_t)pptr;
                                    }
                                    else {
                                      max = (i + -1) * (uint32_t)pptr;
                                    }
                                    if (local_a8 == 0) {
                                      grouplength = grouplength - pptr._4_4_;
                                    }
                                    else {
                                      min = (local_a8 + -1) * pptr._4_4_;
                                    }
                                  }
                                }
                              }
                            }
                            goto LAB_00154905;
                          }
                        }
                        BVar6 = set_lookbehind_lengths
                                          ((uint32_t **)&offset,lcptr_local,(int *)recurses_local,
                                           (parsed_recurse_check *)cb_local,_branchminlength);
                        if (BVar6 == 0) {
                          return -1;
                        }
                      }
                    }
                  }
                  goto LAB_00154905;
                }
                offset = offset + 0x10;
              }
            }
LAB_001547ac:
            min = get_grouplength((uint32_t **)&offset,(int *)&lastitemminlength,1,lcptr_local,
                                  (int *)recurses_local,itemminlength,
                                  (parsed_recurse_check *)cb_local,_branchminlength);
            if ((int)min < 0) {
              return -1;
            }
            max = lastitemminlength;
            lastitemlength = min;
          }
        }
      }
    }
LAB_00154905:
    if ((0x7fffffff - grouplength < (int)min) ||
       (grouplength = min + grouplength, 0xffff < grouplength)) {
      *lcptr_local = 0xbb;
      return -1;
    }
    groupminlength = max + groupminlength;
    pptr._4_4_ = min;
    pptr._0_4_ = max;
    offset = offset + 4;
  } while( true );
}

Assistant:

static int
get_branchlength(uint32_t **pptrptr, int *minptr, int *errcodeptr, int *lcptr,
  parsed_recurse_check *recurses, compile_block *cb)
{
int branchlength = 0;
int branchminlength = 0;
int grouplength, groupminlength;
uint32_t lastitemlength = 0;
uint32_t lastitemminlength = 0;
uint32_t *pptr = *pptrptr;
PCRE2_SIZE offset;
parsed_recurse_check this_recurse;

/* A large and/or complex regex can take too long to process. This can happen
more often when (?| groups are present in the pattern because their length
cannot be cached. */

if ((*lcptr)++ > 2000)
  {
  *errcodeptr = ERR35;  /* Lookbehind is too complicated */
  return -1;
  }

/* Scan the branch, accumulating the length. */

for (;; pptr++)
  {
  parsed_recurse_check *r;
  uint32_t *gptr, *gptrend;
  uint32_t escape;
  uint32_t group = 0;
  uint32_t itemlength = 0;
  uint32_t itemminlength = 0;
  uint32_t min, max;

  if (*pptr < META_END)
    {
    itemlength = itemminlength = 1;
    }

  else switch (META_CODE(*pptr))
    {
    case META_KET:
    case META_ALT:
    goto EXIT;

    /* (*ACCEPT) and (*FAIL) terminate the branch, but we must skip to the
    actual termination. */

    case META_ACCEPT:
    case META_FAIL:
    pptr = parsed_skip(pptr, PSKIP_ALT);
    if (pptr == NULL) goto PARSED_SKIP_FAILED;
    goto EXIT;

    case META_MARK:
    case META_COMMIT_ARG:
    case META_PRUNE_ARG:
    case META_SKIP_ARG:
    case META_THEN_ARG:
    pptr += pptr[1] + 1;
    break;

    case META_CIRCUMFLEX:
    case META_COMMIT:
    case META_DOLLAR:
    case META_PRUNE:
    case META_SKIP:
    case META_THEN:
    break;

    case META_OPTIONS:
    pptr += 2;
    break;

    case META_BIGVALUE:
    itemlength = itemminlength = 1;
    pptr += 1;
    break;

    case META_CLASS:
    case META_CLASS_NOT:
    itemlength = itemminlength = 1;
    pptr = parsed_skip(pptr, PSKIP_CLASS);
    if (pptr == NULL) goto PARSED_SKIP_FAILED;
    break;

    case META_CLASS_EMPTY_NOT:
    case META_DOT:
    itemlength = itemminlength = 1;
    break;

    case META_CALLOUT_NUMBER:
    pptr += 3;
    break;

    case META_CALLOUT_STRING:
    pptr += 3 + SIZEOFFSET;
    break;

    /* Only some escapes consume a character. Of those, \R can match one or two
    characters, but \X is never allowed because it matches an unknown number of
    characters. \C is allowed only in 32-bit and non-UTF 8/16-bit modes. */

    case META_ESCAPE:
    escape = META_DATA(*pptr);
    if (escape == ESC_X) return -1;
    if (escape == ESC_R)
      {
      itemminlength = 1;
      itemlength = 2;
      }
    else if (escape > ESC_b && escape < ESC_Z)
      {
#if PCRE2_CODE_UNIT_WIDTH != 32
      if ((cb->external_options & PCRE2_UTF) != 0 && escape == ESC_C)
        {
        *errcodeptr = ERR36;
        return -1;
        }
#endif
      itemlength = itemminlength = 1;
      if (escape == ESC_p || escape == ESC_P) pptr++;  /* Skip prop data */
      }
    break;

    /* Lookaheads do not contribute to the length of this branch, but they may
    contain lookbehinds within them whose lengths need to be set. */

    case META_LOOKAHEAD:
    case META_LOOKAHEADNOT:
    case META_LOOKAHEAD_NA:
    *errcodeptr = check_lookbehinds(pptr + 1, &pptr, recurses, cb, lcptr);
    if (*errcodeptr != 0) return -1;

    /* Ignore any qualifiers that follow a lookahead assertion. */

    switch (pptr[1])
      {
      case META_ASTERISK:
      case META_ASTERISK_PLUS:
      case META_ASTERISK_QUERY:
      case META_PLUS:
      case META_PLUS_PLUS:
      case META_PLUS_QUERY:
      case META_QUERY:
      case META_QUERY_PLUS:
      case META_QUERY_QUERY:
      pptr++;
      break;

      case META_MINMAX:
      case META_MINMAX_PLUS:
      case META_MINMAX_QUERY:
      pptr += 3;
      break;

      default:
      break;
      }
    break;

    /* A nested lookbehind does not contribute any length to this lookbehind,
    but must itself be checked and have its lengths set. */

    case META_LOOKBEHIND:
    case META_LOOKBEHINDNOT:
    case META_LOOKBEHIND_NA:
    if (!set_lookbehind_lengths(&pptr, errcodeptr, lcptr, recurses, cb))
      return -1;
    break;

    /* Back references and recursions are handled by very similar code. At this
    stage, the names generated in the parsing pass are available, but the main
    name table has not yet been created. So for the named varieties, scan the
    list of names in order to get the number of the first one in the pattern,
    and whether or not this name is duplicated. */

    case META_BACKREF_BYNAME:
    if ((cb->external_options & PCRE2_MATCH_UNSET_BACKREF) != 0)
      goto ISNOTFIXED;
    /* Fall through */

    case META_RECURSE_BYNAME:
      {
      int i;
      PCRE2_SPTR name;
      BOOL is_dupname = FALSE;
      named_group *ng = cb->named_groups;
      uint32_t meta_code = META_CODE(*pptr);
      uint32_t length = *(++pptr);

      GETPLUSOFFSET(offset, pptr);
      name = cb->start_pattern + offset;
      for (i = 0; i < cb->names_found; i++, ng++)
        {
        if (length == ng->length && PRIV(strncmp)(name, ng->name, length) == 0)
          {
          group = ng->number;
          is_dupname = ng->isdup;
          break;
          }
        }

      if (group == 0)
        {
        *errcodeptr = ERR15;  /* Non-existent subpattern */
        cb->erroroffset = offset;
        return -1;
        }

      /* A numerical back reference can be fixed length if duplicate capturing
      groups are not being used. A non-duplicate named back reference can also
      be handled. */

      if (meta_code == META_RECURSE_BYNAME ||
          (!is_dupname && (cb->external_flags & PCRE2_DUPCAPUSED) == 0))
        goto RECURSE_OR_BACKREF_LENGTH;  /* Handle as a numbered version. */
      }
    goto ISNOTFIXED;                     /* Duplicate name or number */

    /* The offset values for back references < 10 are in a separate vector
    because otherwise they would use more than two parsed pattern elements on
    64-bit systems. */

    case META_BACKREF:
    if ((cb->external_options & PCRE2_MATCH_UNSET_BACKREF) != 0 ||
        (cb->external_flags & PCRE2_DUPCAPUSED) != 0)
      goto ISNOTFIXED;
    group = META_DATA(*pptr);
    if (group < 10)
      {
      offset = cb->small_ref_offset[group];
      goto RECURSE_OR_BACKREF_LENGTH;
      }

    /* Fall through */
    /* For groups >= 10 - picking up group twice does no harm. */

    /* A true recursion implies not fixed length, but a subroutine call may
    be OK. Back reference "recursions" are also failed. */

    case META_RECURSE:
    group = META_DATA(*pptr);
    GETPLUSOFFSET(offset, pptr);

    RECURSE_OR_BACKREF_LENGTH:
    if (group > cb->bracount)
      {
      cb->erroroffset = offset;
      *errcodeptr = ERR15;  /* Non-existent subpattern */
      return -1;
      }
    if (group == 0) goto ISNOTFIXED;  /* Local recursion */
    for (gptr = cb->parsed_pattern; *gptr != META_END; gptr++)
      {
      if (META_CODE(*gptr) == META_BIGVALUE) gptr++;
        else if (*gptr == (META_CAPTURE | group)) break;
      }

    /* We must start the search for the end of the group at the first meta code
    inside the group. Otherwise it will be treated as an enclosed group. */

    gptrend = parsed_skip(gptr + 1, PSKIP_KET);
    if (gptrend == NULL) goto PARSED_SKIP_FAILED;
    if (pptr > gptr && pptr < gptrend) goto ISNOTFIXED;  /* Local recursion */
    for (r = recurses; r != NULL; r = r->prev) if (r->groupptr == gptr) break;
    if (r != NULL) goto ISNOTFIXED;   /* Mutual recursion */
    this_recurse.prev = recurses;
    this_recurse.groupptr = gptr;

    /* We do not need to know the position of the end of the group, that is,
    gptr is not used after the call to get_grouplength(). Setting the second
    argument FALSE stops it scanning for the end when the length can be found
    in the cache. */

    gptr++;
    grouplength = get_grouplength(&gptr, &groupminlength, FALSE, errcodeptr,
      lcptr, group, &this_recurse, cb);
    if (grouplength < 0)
      {
      if (*errcodeptr == 0) goto ISNOTFIXED;
      return -1;  /* Error already set */
      }
    itemlength = grouplength;
    itemminlength = groupminlength;
    break;

    /* A (DEFINE) group is never obeyed inline and so it does not contribute to
    the length of this branch. Skip from the following item to the next
    unpaired ket. */

    case META_COND_DEFINE:
    pptr = parsed_skip(pptr + 1, PSKIP_KET);
    break;

    /* Check other nested groups - advance past the initial data for each type
    and then seek a fixed length with get_grouplength(). */

    case META_COND_NAME:
    case META_COND_NUMBER:
    case META_COND_RNAME:
    case META_COND_RNUMBER:
    pptr += 2 + SIZEOFFSET;
    goto CHECK_GROUP;

    case META_COND_ASSERT:
    pptr += 1;
    goto CHECK_GROUP;

    case META_COND_VERSION:
    pptr += 4;
    goto CHECK_GROUP;

    case META_CAPTURE:
    group = META_DATA(*pptr);
    /* Fall through */

    case META_ATOMIC:
    case META_NOCAPTURE:
    case META_SCRIPT_RUN:
    pptr++;
    CHECK_GROUP:
    grouplength = get_grouplength(&pptr, &groupminlength, TRUE, errcodeptr,
      lcptr, group, recurses, cb);
    if (grouplength < 0) return -1;
    itemlength = grouplength;
    itemminlength = groupminlength;
    break;

    case META_QUERY:
    case META_QUERY_PLUS:
    case META_QUERY_QUERY:
    min = 0;
    max = 1;
    goto REPETITION;

    /* Exact repetition is OK; variable repetition is not. A repetition of zero
    must subtract the length that has already been added. */

    case META_MINMAX:
    case META_MINMAX_PLUS:
    case META_MINMAX_QUERY:
    min = pptr[1];
    max = pptr[2];
    pptr += 2;

    REPETITION:
    if (max != REPEAT_UNLIMITED)
      {
      if (lastitemlength != 0 &&  /* Should not occur, but just in case */
          max != 0 &&
          (INT_MAX - branchlength)/lastitemlength < max - 1)
        {
        *errcodeptr = ERR87;  /* Integer overflow; lookbehind too big */
        return -1;
        }
      if (min == 0) branchminlength -= lastitemminlength;
        else itemminlength = (min - 1) * lastitemminlength;
      if (max == 0) branchlength -= lastitemlength;
        else itemlength = (max - 1) * lastitemlength;
      break;
      }
    /* Fall through */

    /* Any other item means this branch does not have a fixed length. */

    default:
    ISNOTFIXED:
    *errcodeptr = ERR25;   /* Not fixed length */
    return -1;
    }

  /* Add the item length to the branchlength, checking for integer overflow and
  for the branch length exceeding the overall limit. Later, if there is at
  least one variable-length branch in the group, there is a test for the
  (smaller) variable-length branch length limit. */

  if (INT_MAX - branchlength < (int)itemlength ||
      (branchlength += itemlength) > LOOKBEHIND_MAX)
    {
    *errcodeptr = ERR87;
    return -1;
    }

  branchminlength += itemminlength;

  /* Save this item length for use if the next item is a quantifier. */

  lastitemlength = itemlength;
  lastitemminlength = itemminlength;
  }

EXIT:
*pptrptr = pptr;
*minptr = branchminlength;
return branchlength;

PARSED_SKIP_FAILED:
*errcodeptr = ERR90;
return -1;
}